

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

void deflate_find_min_cost_path(libdeflate_compressor *c,u32 block_length,lz_match *cache_ptr)

{
  ushort uVar1;
  uint uVar2;
  uint *puVar3;
  ushort *puVar4;
  ushort *in_RDX;
  uint in_ESI;
  libdeflate_compressor *in_RDI;
  u32 cost_to_end;
  u32 offset_cost;
  u32 offset_slot;
  u32 offset;
  u32 len;
  lz_match *match;
  u32 best_cost_to_end;
  u32 literal;
  uint num_matches;
  deflate_optimum_node *cur_node;
  deflate_optimum_node *end_node;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint local_44;
  ushort *local_40;
  uint local_34;
  uint *local_28;
  ushort *local_18;
  
  local_28 = (uint *)((long)&in_RDI->p + (ulong)in_ESI * 8 + 0x639584);
  *local_28 = 0;
  local_18 = in_RDX;
  do {
    puVar3 = local_28 + -2;
    puVar4 = local_18 + -2;
    uVar2 = (uint)*puVar4;
    local_34 = *(int *)((long)&in_RDI->p + (ulong)(uint)local_18[-1] * 4 + 0x88d0c4) + *local_28;
    local_28[-1] = (uint)local_18[-1] << 9 | 1;
    local_18 = puVar4;
    if (uVar2 != 0) {
      local_40 = puVar4 + (ulong)uVar2 * -2;
      local_44 = 3;
      do {
        uVar1 = local_40[1];
        in_stack_ffffffffffffffb4 =
             (uint)*(byte *)((long)&in_RDI->p + (ulong)(uint)uVar1 + 0x88e1dc);
        in_stack_ffffffffffffffb0 =
             *(int *)((long)&in_RDI->p + (ulong)in_stack_ffffffffffffffb4 * 4 + 0x88d8d0);
        do {
          in_stack_ffffffffffffffac =
               in_stack_ffffffffffffffb0 +
               *(int *)((long)&in_RDI->p + (ulong)local_44 * 4 + 0x88d4c4) +
               puVar3[(ulong)local_44 * 2];
          if (in_stack_ffffffffffffffac < local_34) {
            local_28[-1] = local_44 | (uint)uVar1 << 9;
            local_34 = in_stack_ffffffffffffffac;
          }
          local_44 = local_44 + 1;
        } while (local_44 <= *local_40);
        local_40 = local_40 + 2;
      } while (local_40 != puVar4);
      local_18 = puVar4 + (ulong)uVar2 * -2;
    }
    *puVar3 = local_34;
    local_28 = puVar3;
  } while (puVar3 != (uint *)((long)&in_RDI->p + 0x639584));
  deflate_reset_symbol_frequencies((libdeflate_compressor *)0x118ab3);
  deflate_tally_item_list(in_RDI,in_ESI);
  deflate_make_huffman_codes
            ((deflate_freqs *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (deflate_codes *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  return;
}

Assistant:

static void
deflate_find_min_cost_path(struct libdeflate_compressor *c,
			   const u32 block_length,
			   const struct lz_match *cache_ptr)
{
	struct deflate_optimum_node *end_node =
		&c->p.n.optimum_nodes[block_length];
	struct deflate_optimum_node *cur_node = end_node;

	cur_node->cost_to_end = 0;
	do {
		unsigned num_matches;
		u32 literal;
		u32 best_cost_to_end;

		cur_node--;
		cache_ptr--;

		num_matches = cache_ptr->length;
		literal = cache_ptr->offset;

		/* It's always possible to choose a literal. */
		best_cost_to_end = c->p.n.costs.literal[literal] +
				   (cur_node + 1)->cost_to_end;
		cur_node->item = (literal << OPTIMUM_OFFSET_SHIFT) | 1;

		/* Also consider matches if there are any. */
		if (num_matches) {
			const struct lz_match *match;
			u32 len;
			u32 offset;
			u32 offset_slot;
			u32 offset_cost;
			u32 cost_to_end;

			/*
			 * Consider each length from the minimum
			 * (DEFLATE_MIN_MATCH_LEN) to the length of the longest
			 * match found at this position.  For each length, we
			 * consider only the smallest offset for which that
			 * length is available.  Although this is not guaranteed
			 * to be optimal due to the possibility of a larger
			 * offset costing less than a smaller offset to code,
			 * this is a very useful heuristic.
			 */
			match = cache_ptr - num_matches;
			len = DEFLATE_MIN_MATCH_LEN;
			do {
				offset = match->offset;
				offset_slot = c->p.n.offset_slot_full[offset];
				offset_cost =
					c->p.n.costs.offset_slot[offset_slot];
				do {
					cost_to_end = offset_cost +
						c->p.n.costs.length[len] +
						(cur_node + len)->cost_to_end;
					if (cost_to_end < best_cost_to_end) {
						best_cost_to_end = cost_to_end;
						cur_node->item = len |
							(offset <<
							 OPTIMUM_OFFSET_SHIFT);
					}
				} while (++len <= match->length);
			} while (++match != cache_ptr);
			cache_ptr -= num_matches;
		}
		cur_node->cost_to_end = best_cost_to_end;
	} while (cur_node != &c->p.n.optimum_nodes[0]);

	deflate_reset_symbol_frequencies(c);
	deflate_tally_item_list(c, block_length);
	deflate_make_huffman_codes(&c->freqs, &c->codes);
}